

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzFolder_Decode2(CSzFolder *folder,Byte *propsData,UInt64 *unpackSizes,UInt64 *packPositions,
                     ILookInStream *inStream,UInt64 startPos,Byte *outBuffer,SizeT outSize,
                     ISzAlloc *allocMain,Byte **tempBuf)

{
  Bool_conflict BVar1;
  SRes SVar2;
  undefined8 uVar3;
  long in_RCX;
  long in_RDX;
  uint *in_RDI;
  Byte *in_stack_00000008;
  UInt32 state_1;
  Byte state [256];
  uint i;
  int __result___8;
  CBcj2Dec p;
  int __result___7;
  int __result___6;
  UInt64 s3Size;
  UInt64 offset_1;
  int __result___5;
  int __result___4;
  int __result___3;
  int __result___2;
  int __result___1;
  Byte *temp;
  UInt64 unpackSize;
  UInt32 indices [3];
  SizeT outSizeCur;
  Byte *outBufCur;
  UInt64 inSize;
  UInt64 offset;
  UInt32 si;
  CSzCoderInfo *coder;
  int __result__;
  Byte *tempBuf3;
  SizeT tempSize3;
  SizeT tempSizes [3];
  UInt32 ci;
  SizeT in_stack_00004700;
  Byte *in_stack_00004708;
  ILookInStream *in_stack_00004710;
  UInt64 in_stack_00004718;
  uint in_stack_00004724;
  Byte *in_stack_00004728;
  ISzAlloc *in_stack_00004740;
  CBcj2Dec *in_stack_fffffffffffffb88;
  uint in_stack_fffffffffffffb90;
  UInt32 in_stack_fffffffffffffb94;
  CSzFolder *in_stack_fffffffffffffb98;
  ILookInStream *in_stack_fffffffffffffba0;
  UInt64 in_stack_fffffffffffffba8;
  SizeT in_stack_fffffffffffffc40;
  Byte *in_stack_fffffffffffffc48;
  ILookInStream *in_stack_fffffffffffffc50;
  UInt64 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc64;
  Byte *in_stack_fffffffffffffc68;
  ILookInStream *in_stack_fffffffffffffc70;
  UInt64 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  Byte *in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  Byte *in_stack_fffffffffffffca8;
  Byte *in_stack_fffffffffffffcb0;
  Byte *in_stack_fffffffffffffcb8;
  Byte *in_stack_fffffffffffffcc0;
  Byte *local_338 [4];
  Byte *local_318;
  Byte *local_310;
  uint local_308;
  UInt32 local_2f8;
  SRes local_f0;
  SRes local_ec;
  long local_e8;
  long local_e0;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  SRes local_c4;
  Byte *local_c0;
  ulong local_b8;
  uint local_ac [3];
  ulong local_a0;
  Byte *local_98;
  ulong local_90;
  long local_88;
  uint local_7c;
  uint *local_78;
  undefined4 local_6c;
  Byte *local_68;
  ulong local_60;
  ulong local_58 [3];
  uint local_3c;
  long local_28;
  long local_20;
  uint *local_10;
  SRes local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(local_58,0,0x18);
  local_60 = 0;
  local_68 = (Byte *)0x0;
  local_4 = CheckSupportedFolder(in_stack_fffffffffffffb98);
  if (local_4 == 0) {
    local_6c = 0;
    for (local_3c = 0; local_3c < *local_10; local_3c = local_3c + 1) {
      local_78 = local_10 + (ulong)local_3c * 4 + 0xe;
      BVar1 = IS_MAIN_METHOD(local_78[2]);
      if (BVar1 == 0) {
        if (local_78[2] == 0x303011b) {
          local_e0 = *(long *)(local_28 + 8);
          local_e8 = *(long *)(local_28 + 0x10) - local_e0;
          if (local_3c != 3) {
            return 4;
          }
          local_58[2] = local_e8;
          uVar3 = (**(code **)state._8_8_)(state._8_8_,local_e8);
          *(undefined8 *)(state._16_8_ + 0x10) = uVar3;
          if ((*(long *)(state._16_8_ + 0x10) == 0) && (local_58[2] != 0)) {
            return 2;
          }
          local_ec = LookInStream_SeekTo((ILookInStream *)
                                         CONCAT44(in_stack_fffffffffffffb94,
                                                  in_stack_fffffffffffffb90),
                                         (UInt64)in_stack_fffffffffffffb88);
          if (local_ec != 0) {
            return local_ec;
          }
          local_f0 = SzDecodeCopy(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                                  (Byte *)in_stack_fffffffffffffb98);
          if (local_f0 != 0) {
            return local_f0;
          }
          if ((((local_58[0] & 3) != 0) || ((local_58[1] & 3) != 0)) ||
             (local_60 + local_58[0] + local_58[1] != state._0_8_)) {
            return 1;
          }
          local_338[0] = local_68 + local_60;
          in_stack_fffffffffffffcb0 = *(Byte **)state._16_8_;
          local_338[1] = (Byte *)(*(long *)state._16_8_ + local_58[0]);
          in_stack_fffffffffffffcb8 = *(Byte **)(state._16_8_ + 8);
          local_338[2] = (Byte *)(*(long *)(state._16_8_ + 8) + local_58[1]);
          in_stack_fffffffffffffcc0 = *(Byte **)(state._16_8_ + 0x10);
          local_338[3] = (Byte *)(*(long *)(state._16_8_ + 0x10) + local_58[2]);
          local_318 = in_stack_00000008;
          local_310 = in_stack_00000008 + state._0_8_;
          in_stack_fffffffffffffca8 = local_68;
          Bcj2Dec_Init((CBcj2Dec *)&stack0xfffffffffffffca8);
          SVar2 = Bcj2Dec_Decode(in_stack_fffffffffffffb88);
          if (SVar2 != 0) {
            return SVar2;
          }
          for (in_stack_fffffffffffffca0 = 0; in_stack_fffffffffffffca0 < 4;
              in_stack_fffffffffffffca0 = in_stack_fffffffffffffca0 + 1) {
            if (local_338[(ulong)in_stack_fffffffffffffca0 - 4] !=
                local_338[in_stack_fffffffffffffca0]) {
              return 1;
            }
          }
          if (local_2f8 != 0) {
            return 1;
          }
          if ((local_318 != local_310) || (local_308 != 0)) {
            return 1;
          }
          in_stack_fffffffffffffca4 = 0;
        }
        else {
          if (local_3c != 1) {
            return 4;
          }
          if (local_78[2] == 3) {
            if (*(char *)((long)local_78 + 0xd) != '\x01') {
              return 4;
            }
            Delta_Init(&stack0xfffffffffffffb98);
            Delta_Decode(in_stack_fffffffffffffcc0,(uint)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                         in_stack_fffffffffffffcb0,(SizeT)in_stack_fffffffffffffca8);
          }
          else {
            if (*(char *)((long)local_78 + 0xd) != '\0') {
              return 4;
            }
            in_stack_fffffffffffffb90 = local_78[2];
            if (in_stack_fffffffffffffb90 == 0x3030103) {
              in_stack_fffffffffffffb94 = 0;
              x86_Convert(in_stack_00000008,state._0_8_,0,(UInt32 *)&stack0xfffffffffffffb94,0);
            }
            else if (in_stack_fffffffffffffb90 == 0x3030205) {
              PPC_Convert(in_stack_00000008,state._0_8_,0,0);
            }
            else if (in_stack_fffffffffffffb90 == 0x3030401) {
              IA64_Convert(in_stack_00000008,state._0_8_,0,0);
            }
            else if (in_stack_fffffffffffffb90 == 0x3030501) {
              ARM_Convert(in_stack_00000008,state._0_8_,0,0);
            }
            else if (in_stack_fffffffffffffb90 == 0x3030701) {
              ARMT_Convert(in_stack_00000008,state._0_8_,0,0);
            }
            else {
              if (in_stack_fffffffffffffb90 != 0x3030805) {
                return 4;
              }
              SPARC_Convert(in_stack_00000008,state._0_8_,0,0);
            }
          }
        }
      }
      else {
        local_7c = 0;
        local_98 = in_stack_00000008;
        local_a0 = state._0_8_;
        if (*local_10 == 4) {
          local_ac[0] = 3;
          local_ac[1] = 2;
          local_ac[2] = 0;
          local_b8 = *(ulong *)(local_20 + (ulong)local_3c * 8);
          local_7c = local_ac[local_3c];
          local_a0 = local_b8;
          if (local_3c < 2) {
            local_c0 = (Byte *)(**(code **)state._8_8_)(state._8_8_,local_b8);
            if ((local_c0 == (Byte *)0x0) && (local_a0 != 0)) {
              return 2;
            }
            *(Byte **)(state._16_8_ + (ulong)(1 - local_3c) * 8) = local_c0;
            local_58[1 - local_3c] = local_a0;
            local_98 = local_c0;
          }
          else {
            if (local_3c != 2) {
              return 4;
            }
            if ((ulong)state._0_8_ < local_b8) {
              return 5;
            }
            local_98 = in_stack_00000008 + (state._0_8_ - local_b8);
            local_68 = local_98;
            local_60 = local_b8;
          }
        }
        local_88 = *(long *)(local_28 + (ulong)local_7c * 8);
        local_90 = *(long *)(local_28 + (ulong)(local_7c + 1) * 8) - local_88;
        local_c4 = LookInStream_SeekTo((ILookInStream *)
                                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90)
                                       ,(UInt64)in_stack_fffffffffffffb88);
        if (local_c4 != 0) {
          return local_c4;
        }
        if (local_78[2] == 0) {
          if (local_90 != local_a0) {
            return 1;
          }
          SVar2 = SzDecodeCopy(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                               (Byte *)in_stack_fffffffffffffb98);
          if (SVar2 != 0) {
            return SVar2;
          }
          local_c8 = 0;
        }
        else {
          in_stack_fffffffffffffb88 = (CBcj2Dec *)state._8_8_;
          if (local_78[2] == 0x30101) {
            SVar2 = SzDecodeLzma(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
                                 in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                                 in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                 (ISzAlloc *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
            if (SVar2 != 0) {
              return SVar2;
            }
            local_cc = 0;
          }
          else if (local_78[2] == 0x21) {
            SVar2 = SzDecodeLzma2(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                                  in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                                  in_stack_fffffffffffffc68,
                                  CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                                  (ISzAlloc *)
                                  CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
            if (SVar2 != 0) {
              return SVar2;
            }
            local_d0 = 0;
          }
          else {
            if (local_78[2] != 0x30401) {
              return 4;
            }
            SVar2 = SzDecodePpmd(in_stack_00004728,in_stack_00004724,in_stack_00004718,
                                 in_stack_00004710,in_stack_00004708,in_stack_00004700,
                                 in_stack_00004740);
            if (SVar2 != 0) {
              return SVar2;
            }
            local_d4 = 0;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static SRes SzFolder_Decode2(const CSzFolder *folder,
    const Byte *propsData,
    const UInt64 *unpackSizes,
    const UInt64 *packPositions,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, SizeT outSize, ISzAlloc *allocMain,
    Byte *tempBuf[])
{
  UInt32 ci;
  SizeT tempSizes[3] = { 0, 0, 0};
  SizeT tempSize3 = 0;
  Byte *tempBuf3 = 0;

  RINOK(CheckSupportedFolder(folder));

  for (ci = 0; ci < folder->NumCoders; ci++)
  {
    const CSzCoderInfo *coder = &folder->Coders[ci];

    if (IS_MAIN_METHOD((UInt32)coder->MethodID))
    {
      UInt32 si = 0;
      UInt64 offset;
      UInt64 inSize;
      Byte *outBufCur = outBuffer;
      SizeT outSizeCur = outSize;
      if (folder->NumCoders == 4)
      {
        UInt32 indices[] = { 3, 2, 0 };
        UInt64 unpackSize = unpackSizes[ci];
        si = indices[ci];
        if (ci < 2)
        {
          Byte *temp;
          outSizeCur = (SizeT)unpackSize;
          if (outSizeCur != unpackSize)
            return SZ_ERROR_MEM;
          temp = (Byte *)IAlloc_Alloc(allocMain, outSizeCur);
          if (!temp && outSizeCur != 0)
            return SZ_ERROR_MEM;
          outBufCur = tempBuf[1 - ci] = temp;
          tempSizes[1 - ci] = outSizeCur;
        }
        else if (ci == 2)
        {
          if (unpackSize > outSize) /* check it */
            return SZ_ERROR_PARAM;
          tempBuf3 = outBufCur = outBuffer + (outSize - (size_t)unpackSize);
          tempSize3 = outSizeCur = (SizeT)unpackSize;
        }
        else
          return SZ_ERROR_UNSUPPORTED;
      }
      offset = packPositions[si];
      inSize = packPositions[si + 1] - offset;
      RINOK(LookInStream_SeekTo(inStream, startPos + offset));

      if (coder->MethodID == k_Copy)
      {
        if (inSize != outSizeCur) /* check it */
          return SZ_ERROR_DATA;
        RINOK(SzDecodeCopy(inSize, inStream, outBufCur));
      }
      else if (coder->MethodID == k_LZMA)
      {
        RINOK(SzDecodeLzma(propsData + coder->PropsOffset, coder->PropsSize, inSize, inStream, outBufCur, outSizeCur, allocMain));
      }
      #ifndef _7Z_NO_METHOD_LZMA2
      else if (coder->MethodID == k_LZMA2)
      {
        RINOK(SzDecodeLzma2(propsData + coder->PropsOffset, coder->PropsSize, inSize, inStream, outBufCur, outSizeCur, allocMain));
      }
      #endif
      #ifdef _7ZIP_PPMD_SUPPPORT
      else if (coder->MethodID == k_PPMD)
      {
        RINOK(SzDecodePpmd(propsData + coder->PropsOffset, coder->PropsSize, inSize, inStream, outBufCur, outSizeCur, allocMain));
      }
      #endif
      else
        return SZ_ERROR_UNSUPPORTED;
    }
    else if (coder->MethodID == k_BCJ2)
    {
      UInt64 offset = packPositions[1];
      UInt64 s3Size = packPositions[2] - offset;
      
      if (ci != 3)
        return SZ_ERROR_UNSUPPORTED;
      
      tempSizes[2] = (SizeT)s3Size;
      if (tempSizes[2] != s3Size)
        return SZ_ERROR_MEM;
      tempBuf[2] = (Byte *)IAlloc_Alloc(allocMain, tempSizes[2]);
      if (!tempBuf[2] && tempSizes[2] != 0)
        return SZ_ERROR_MEM;
      
      RINOK(LookInStream_SeekTo(inStream, startPos + offset));
      RINOK(SzDecodeCopy(s3Size, inStream, tempBuf[2]));

      if ((tempSizes[0] & 3) != 0 ||
          (tempSizes[1] & 3) != 0 ||
          tempSize3 + tempSizes[0] + tempSizes[1] != outSize)
        return SZ_ERROR_DATA;

      {
        CBcj2Dec p;
        
        p.bufs[0] = tempBuf3;   p.lims[0] = tempBuf3 + tempSize3;
        p.bufs[1] = tempBuf[0]; p.lims[1] = tempBuf[0] + tempSizes[0];
        p.bufs[2] = tempBuf[1]; p.lims[2] = tempBuf[1] + tempSizes[1];
        p.bufs[3] = tempBuf[2]; p.lims[3] = tempBuf[2] + tempSizes[2];
        
        p.dest = outBuffer;
        p.destLim = outBuffer + outSize;
        
        Bcj2Dec_Init(&p);
        RINOK(Bcj2Dec_Decode(&p));

        {
          unsigned i;
          for (i = 0; i < 4; i++)
            if (p.bufs[i] != p.lims[i])
              return SZ_ERROR_DATA;
          
          if (!Bcj2Dec_IsFinished(&p))
            return SZ_ERROR_DATA;

          if (p.dest != p.destLim
             || p.state != BCJ2_STREAM_MAIN)
            return SZ_ERROR_DATA;
        }
      }
    }
    #ifndef _7Z_NO_METHODS_FILTERS
    else if (ci == 1)
    {
      if (coder->MethodID == k_Delta)
      {
        if (coder->PropsSize != 1)
          return SZ_ERROR_UNSUPPORTED;
        {
          Byte state[DELTA_STATE_SIZE];
          Delta_Init(state);
          Delta_Decode(state, (unsigned)(propsData[coder->PropsOffset]) + 1, outBuffer, outSize);
        }
      }
      else
      {
        if (coder->PropsSize != 0)
          return SZ_ERROR_UNSUPPORTED;
        switch (coder->MethodID)
        {
          case k_BCJ:
          {
            UInt32 state;
            x86_Convert_Init(state);
            x86_Convert(outBuffer, outSize, 0, &state, 0);
            break;
          }
          CASE_BRA_CONV(PPC)
          CASE_BRA_CONV(IA64)
          CASE_BRA_CONV(SPARC)
          CASE_BRA_CONV(ARM)
          CASE_BRA_CONV(ARMT)
          default:
            return SZ_ERROR_UNSUPPORTED;
        }
      }
    }
    #endif
    else
      return SZ_ERROR_UNSUPPORTED;
  }

  return SZ_OK;
}